

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O0

void Fra_CollectSuper_rec(Aig_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int fUseMuxes_local;
  int fFirst_local;
  Vec_Ptr_t *vSuper_local;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if ((((iVar1 == 0) && (iVar1 = Aig_ObjIsCi(pObj), iVar1 == 0)) &&
      ((fFirst != 0 || (iVar1 = Aig_ObjRefs(pObj), iVar1 < 2)))) &&
     ((fUseMuxes == 0 || (iVar1 = Aig_ObjIsMuxType(pObj), iVar1 == 0)))) {
    pAVar2 = Aig_ObjChild0(pObj);
    Fra_CollectSuper_rec(pAVar2,vSuper,0,fUseMuxes);
    pAVar2 = Aig_ObjChild1(pObj);
    Fra_CollectSuper_rec(pAVar2,vSuper,0,fUseMuxes);
    return;
  }
  Vec_PtrPushUnique(vSuper,pObj);
  return;
}

Assistant:

void Fra_CollectSuper_rec( Aig_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Aig_IsComplement(pObj) || Aig_ObjIsCi(pObj) || (!fFirst && Aig_ObjRefs(pObj) > 1) || 
         (fUseMuxes && Aig_ObjIsMuxType(pObj)) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Fra_CollectSuper_rec( Aig_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Fra_CollectSuper_rec( Aig_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}